

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_default_vfs_info(ma_vfs *pVFS,ma_vfs_file file,ma_file_info *pInfo)

{
  void *in_RDX;
  long in_RSI;
  ma_file_info *in_stack_00000058;
  ma_vfs_file in_stack_00000060;
  ma_vfs *in_stack_00000068;
  undefined4 local_14;
  
  if (in_RDX == (void *)0x0) {
    local_14 = MA_INVALID_ARGS;
  }
  else {
    if (in_RDX != (void *)0x0) {
      memset(in_RDX,0,8);
    }
    if (in_RSI == 0) {
      local_14 = MA_INVALID_ARGS;
    }
    else {
      local_14 = ma_default_vfs_info__stdio(in_stack_00000068,in_stack_00000060,in_stack_00000058);
    }
  }
  return local_14;
}

Assistant:

static ma_result ma_default_vfs_info(ma_vfs* pVFS, ma_vfs_file file, ma_file_info* pInfo)
{
    if (pInfo == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pInfo);

    if (file == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_USE_WIN32_FILEIO)
    return ma_default_vfs_info__win32(pVFS, file, pInfo);
#else
    return ma_default_vfs_info__stdio(pVFS, file, pInfo);
#endif
}